

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.cc
# Opt level: O0

void upb::generator::AddExtensionsFromMessage
               (MessageDefPtr message,
               vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *exts)

{
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *this;
  int iVar1;
  int iVar2;
  MessageDefPtr message_00;
  int local_2c;
  FieldDefPtr FStack_28;
  int i_1;
  int local_1c;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *pvStack_18;
  int i;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *exts_local;
  MessageDefPtr message_local;
  
  local_1c = 0;
  pvStack_18 = exts;
  exts_local = (vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)message.ptr_;
  while( true ) {
    iVar2 = local_1c;
    iVar1 = MessageDefPtr::nested_extension_count((MessageDefPtr *)&exts_local);
    this = pvStack_18;
    if (iVar1 <= iVar2) break;
    FStack_28 = MessageDefPtr::nested_extension((MessageDefPtr *)&exts_local,local_1c);
    std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::push_back
              (this,&stack0xffffffffffffffd8);
    local_1c = local_1c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar2 = MessageDefPtr::nested_message_count((MessageDefPtr *)&exts_local);
    if (iVar2 <= local_2c) break;
    message_00 = MessageDefPtr::nested_message((MessageDefPtr *)&exts_local,local_2c);
    AddExtensionsFromMessage(message_00,pvStack_18);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void AddExtensionsFromMessage(upb::MessageDefPtr message,
                              std::vector<upb::FieldDefPtr>* exts) {
  for (int i = 0; i < message.nested_extension_count(); i++) {
    exts->push_back(message.nested_extension(i));
  }
  for (int i = 0; i < message.nested_message_count(); i++) {
    AddExtensionsFromMessage(message.nested_message(i), exts);
  }
}